

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

Pipeline *
buildEmptyPipelineModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,TensorAttributes *outTensorAttr)

{
  RepeatedField<long> *pRVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Rep *pRVar5;
  ModelDescription *pMVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  void *pvVar11;
  Pipeline *pPVar12;
  undefined8 *puVar13;
  int iVar14;
  Arena *pAVar15;
  
  if (m->description_ == (ModelDescription *)0x0) {
    uVar4 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pMVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar15);
    m->description_ = pMVar6;
  }
  pMVar6 = m->description_;
  pRVar5 = (pMVar6->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 == (Rep *)0x0) {
LAB_00202d92:
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pMVar6->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pMVar6->input_).super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar14 = (pMVar6->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar5->allocated_size <= iVar14) goto LAB_00202d92;
    (pMVar6->input_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
    pvVar11 = pRVar5->elements[iVar14];
  }
  puVar13 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),inTensorAttr->name,puVar13);
  if (*(long *)((long)pvVar11 + 0x20) == 0) {
    pAVar15 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar15);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar15);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pAVar8->datatype_ = 0x10020;
  if (0 < inTensorAttr->dimension) {
    pRVar1 = &pAVar8->shape_;
    iVar14 = 0;
    do {
      uVar2 = (pAVar8->shape_).current_size_;
      uVar3 = (pAVar8->shape_).total_size_;
      if (uVar2 == uVar3) {
        google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
      }
      plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
      plVar9[uVar2] = 1;
      pRVar1->current_size_ = uVar2 + 1;
      iVar14 = iVar14 + 1;
    } while (iVar14 < inTensorAttr->dimension);
  }
  if (m->description_ == (ModelDescription *)0x0) {
    uVar4 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pMVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                       (pAVar15);
    m->description_ = pMVar6;
  }
  pMVar6 = m->description_;
  pRVar5 = (pMVar6->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar5 != (Rep *)0x0) {
    iVar14 = (pMVar6->output_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar14 < pRVar5->allocated_size) {
      (pMVar6->output_).super_RepeatedPtrFieldBase.current_size_ = iVar14 + 1;
      pvVar11 = pRVar5->elements[iVar14];
      goto LAB_00202ee9;
    }
  }
  pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                      ((pMVar6->output_).super_RepeatedPtrFieldBase.arena_);
  pvVar11 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                      (&(pMVar6->output_).super_RepeatedPtrFieldBase,pFVar10);
LAB_00202ee9:
  puVar13 = (undefined8 *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
    puVar13 = (undefined8 *)*puVar13;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar11 + 0x10),outTensorAttr->name,puVar13);
  if (*(long *)((long)pvVar11 + 0x20) == 0) {
    pAVar15 = (Arena *)(*(ulong *)((long)pvVar11 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar11 + 8) & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar15);
    *(FeatureType **)((long)pvVar11 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar11 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar4 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar15);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pAVar8->datatype_ = 0x10020;
  if (0 < outTensorAttr->dimension) {
    pRVar1 = &pAVar8->shape_;
    iVar14 = 0;
    do {
      uVar2 = (pAVar8->shape_).current_size_;
      uVar3 = (pAVar8->shape_).total_size_;
      if (uVar2 == uVar3) {
        google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
      }
      plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
      plVar9[uVar2] = 1;
      pRVar1->current_size_ = uVar2 + 1;
      iVar14 = iVar14 + 1;
    } while (iVar14 < outTensorAttr->dimension);
  }
  m->specificationversion_ = 4;
  if (m->_oneof_case_[0] != 0xca) {
    CoreML::Specification::Model::clear_Type(m);
    m->_oneof_case_[0] = 0xca;
    uVar4 = (m->super_MessageLite)._internal_metadata_.ptr_;
    pAVar15 = (Arena *)(uVar4 & 0xfffffffffffffffc);
    if ((uVar4 & 1) != 0) {
      pAVar15 = *(Arena **)pAVar15;
    }
    pPVar12 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Pipeline>(pAVar15);
    (m->Type_).pipeline_ = pPVar12;
  }
  if (isUpdatable) {
    m->isupdatable_ = true;
  }
  return (Pipeline *)(m->Type_).pipelineclassifier_;
}

Assistant:

Specification::Pipeline* buildEmptyPipelineModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, const TensorAttributes *outTensorAttr) {
    auto inTensor = m.mutable_description()->add_input();
    inTensor->set_name(inTensorAttr->name);
    auto inTensorShape = inTensor->mutable_type()->mutable_multiarraytype();
    inTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < inTensorAttr->dimension; i++) {
        inTensorShape->add_shape(1);
    }
    
    auto outTensor = m.mutable_description()->add_output();
    outTensor->set_name(outTensorAttr->name);
    auto outTensorShape = outTensor->mutable_type()->mutable_multiarraytype();
    outTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_FLOAT32);
    for (int i = 0; i < outTensorAttr->dimension; i++) {
        outTensorShape->add_shape(1);
    }
    
    m.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);
    
    auto pipeline = m.mutable_pipeline();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
    }
    
    return pipeline;
}